

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O0

void keyboard_controls_proc(Am_Object *cmd)

{
  char cVar1;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  Am_Object *pAVar7;
  ostream *poVar8;
  ostream *this;
  ulong uVar9;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38 [2];
  int i;
  Am_Input_Char local_1c;
  Am_Input_Char c;
  Am_Object inter;
  Am_Object *cmd_local;
  
  Am_Object::Get_Owner((Am_Object *)&stack0xffffffffffffffe8,(Am_Slot_Flags)cmd);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)(Am_Object *)&stack0xffffffffffffffe8,0x11b);
  Am_Input_Char::Am_Input_Char(&local_1c,pAVar6);
  cVar1 = Am_Input_Char::As_Char();
  if (cVar1 != ' ') {
    if ((cVar1 == '?') || (cVar1 == 'h')) {
      poVar8 = std::operator<<((ostream *)&std::cout,"q = quit\n");
      poVar8 = std::operator<<(poVar8,"p = pause (wait forever)\n");
      poVar8 = std::operator<<(poVar8,"j = move left\n");
      poVar8 = std::operator<<(poVar8,"l = move right\n");
      poVar8 = std::operator<<(poVar8,"i or space = shoot\n");
      this = (ostream *)
             std::ostream::operator<<((ostream *)poVar8,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
      goto LAB_00104b77;
    }
    if (cVar1 != 'i') {
      if (cVar1 == 'j') {
        Am_Object::Set(0xb2c8,100,10);
      }
      else if (cVar1 == 'l') {
        Am_Object::Get_Owner(local_38,0x10b2c8);
        pAVar6 = (Am_Value *)Am_Object::Get((ushort)local_38,0x66);
        iVar4 = Am_Value::operator_cast_to_int(pAVar6);
        pAVar6 = (Am_Value *)Am_Object::Get(0xb2c8,0x66);
        iVar5 = Am_Value::operator_cast_to_int(pAVar6);
        Am_Object::Set(0xb2c8,100,(ulong)((iVar4 - iVar5) - 10));
        Am_Object::~Am_Object(local_38);
      }
      else {
        if (cVar1 == 'p') {
          do {
          } while( true );
        }
        if (cVar1 == 'q') {
          Am_Exit_Main_Event_Loop();
        }
        else {
          uVar9 = Am_Object::Get(0xb2c8,100);
          Am_Object::Set(0xb2c8,(Am_Value *)0x64,uVar9);
        }
      }
      goto LAB_00104b77;
    }
  }
  if (num_bullets < 2) {
    pAVar6 = (Am_Value *)Am_Object::Get(0xb2c8,0x69);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar6);
    if (bVar2) {
      Am_Object::Get_Owner(&local_40,0x10b2c8);
      Am_Object::Create((char *)&local_50);
      pAVar6 = (Am_Value *)Am_Object::Get(0xb2c8,100);
      iVar4 = Am_Value::operator_cast_to_int(pAVar6);
      pAVar6 = (Am_Value *)Am_Object::Get(0xb2c8,0x66);
      iVar5 = Am_Value::operator_cast_to_int(pAVar6);
      uVar3 = Am_Object::Set((ushort)&local_50,100,(ulong)(uint)(iVar4 + iVar5 / 2));
      pAVar6 = (Am_Value *)Am_Object::Get(0xb2d0,0x67);
      iVar4 = Am_Value::operator_cast_to_int(pAVar6);
      pAVar7 = (Am_Object *)Am_Object::Set(uVar3,0x65,(ulong)(uint)-iVar4);
      Am_Object::Am_Object(&local_48,pAVar7);
      Am_Object::Add_Part((Am_Object_Data *)&local_40,SUB81(&local_48,0),1);
      Am_Object::~Am_Object(&local_48);
      Am_Object::~Am_Object(&local_50);
      Am_Object::~Am_Object(&local_40);
      num_bullets = num_bullets + 1;
    }
  }
LAB_00104b77:
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, keyboard_controls, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  Am_Input_Char c = inter.Get(Am_START_CHAR);
  switch (c.As_Char()) {
  case 'p': {
    int i = 0;
    while (true) { //pause, wait forever
      i++;
    }
  }
  case 'j': // left
    Ship.Set(Am_LEFT, 10);
    break;
  case 'l': // right
    Ship.Set(Am_LEFT, (int)Ship.Get_Owner().Get(Am_WIDTH) -
                          (int)Ship.Get(Am_WIDTH) - 10);
    break;
  case ' ':
  case 'i': // shoot
    if (num_bullets < MAX_BULLETS && (bool)Ship.Get(Am_VISIBLE)) {
      Ship.Get_Owner().Add_Part(
          Bullet.Create()
              .Set(Am_LEFT,
                   (int)Ship.Get(Am_LEFT) + ((int)Ship.Get(Am_WIDTH) / 2))
              .Set(Am_TOP, -(int)Bullet.Get(Am_HEIGHT)));
      num_bullets++;
    }
    break;
  case 'q':
    Am_Exit_Main_Event_Loop();
    break;
  case '?':
  case 'h':
    cout << "q = quit\n"
         << "p = pause (wait forever)\n"
         << "j = move left\n"
         << "l = move right\n"
         << "i or space = shoot\n"
         << endl
         << flush;
    break;
  default: // stop
    // stop the ship where it is
    Ship.Set(Am_LEFT, Ship.Get(Am_LEFT));
  }
}